

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

string * __thiscall
bsim::quad_value_bit_vector::hex_string_abi_cxx11_
          (string *__return_storage_ptr__,quad_value_bit_vector *this)

{
  byte bVar1;
  pointer pqVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  allocator local_79;
  string hex_digits;
  string hex;
  
  std::__cxx11::to_string(&hex_digits,this->N);
  std::operator+(&hex,&hex_digits,"\'h");
  std::__cxx11::string::~string((string *)&hex_digits);
  std::__cxx11::string::string((string *)&hex_digits,"",&local_79);
  lVar4 = 0;
  do {
    if (*(int *)&(this->bits).
                 super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                 super__Vector_impl_data._M_finish -
        *(int *)&(this->bits).
                 super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                 super__Vector_impl_data._M_start <= lVar4) {
      std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (hex_digits._M_dataplus._M_p,
                 hex_digits._M_dataplus._M_p + hex_digits._M_string_length);
      std::operator+(__return_storage_ptr__,&hex,&hex_digits);
      std::__cxx11::string::~string((string *)&hex_digits);
      std::__cxx11::string::~string((string *)&hex);
      return __return_storage_ptr__;
    }
    lVar5 = 4;
    lVar3 = lVar4;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      pqVar2 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((int)lVar3 <
          *(int *)&(this->bits).
                   super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                   super__Vector_impl_data._M_finish - (int)pqVar2) {
        bVar1 = pqVar2[lVar3].value;
        if (1 < bVar1) {
          if ((bVar1 != 2) && (bVar1 != 3)) {
            __assert_fail("bits[index].is_high_impedance()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                          ,0x1b9,"std::string bsim::quad_value_bit_vector::hex_string() const");
          }
          break;
        }
        quad_value::binary_value(pqVar2 + lVar3);
      }
      lVar3 = lVar3 + 1;
    }
    std::__cxx11::string::push_back((char)&hex_digits);
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

std::string hex_string() const {
      std::string hex = std::to_string(N) + "'h";

      std::string hex_digits = "";

      for (int i = 0; i < ((int) bits.size()); i += 4) {
        unsigned char bit_l = 0;
        bool found_abnormal = false;

        for (int j = 0; j < 4; j++) {
          int index = i + j;
          if (index >= ((int) bits.size())) {
          } else {
            if (bits[index].is_binary()) {
              bit_l |= (bits[index].binary_value() & 0x01) << j;
            } else if (bits[index].is_unknown()) {
              bit_l = 'x';
              found_abnormal = true;
              break;
            } else {
              assert(bits[index].is_high_impedance());
              bit_l = 'z';
              found_abnormal = true;
              break;
            }
          }
        }

        if (!found_abnormal) {
          hex_digits += bit_l > 9 ? bit_l + 87 : bit_l + 48;
        } else {
          hex_digits += bit_l;
        }

      }

      std::reverse(std::begin(hex_digits), std::end(hex_digits));
      return hex + hex_digits;
    }